

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void request_handler_clbk(uint32_t cmd,char *data,uint32_t size)

{
  uint in_EDX;
  int led_i;
  allocator<char> *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  if (2 < in_EDX) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0
              );
    setLedState((GPIOClass *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  }
  return;
}

Assistant:

void request_handler_clbk(uint32_t cmd, char const * data, uint32_t size) 
{    
	if(size > 2)
    {
        int led_i = int(data[1]-'0') % LEDS_CNT;
        setLedState(&ledPool[led_i], (data[2] != '0') ? LED_SET_STATE : LED_RESET_STATE);
    }
}